

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O2

void __thiscall
SoundConfigTab::SoundConfigTab
          (SoundConfigTab *this,MidiConfig *midiConfig,SoundConfig *soundConfig,
          AudioEnumerator *audio,MidiEnumerator *midi,QWidget *parent)

{
  AudioEnumerator *enumerator;
  MidiEnumerator *enumerator_00;
  int iVar1;
  uint device;
  int device_00;
  DeviceGroup *pDVar2;
  QGroupBox *this_00;
  QGridLayout *this_01;
  QLabel *pQVar3;
  QSpinBox *pQVar4;
  QComboBox *pQVar5;
  QVBoxLayout *this_02;
  ulong uVar6;
  int min;
  int min_00;
  ConnectionType type;
  size_t index;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  undefined8 local_d0;
  SoundConfig *local_c0;
  MidiConfig *local_b8;
  Object local_b0 [8];
  Object local_a8 [8];
  Object local_a0 [8];
  Object local_98 [8];
  Object local_90 [8];
  Object local_88 [8];
  Object local_80 [8];
  Object local_78 [8];
  Object local_70 [8];
  Object local_68 [8];
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  local_c0 = soundConfig;
  local_b8 = midiConfig;
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_001f1bf0;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__SoundConfigTab_001f1da0;
  this->mAudioEnumerator = audio;
  this->mMidiEnumerator = midi;
  pDVar2 = (DeviceGroup *)operator_new(0x48);
  tr((QString *)&local_e8,"Output device",(char *)0x0,-1);
  DeviceGroup::DeviceGroup(pDVar2,(QString *)&local_e8);
  this->mAudioGroup = pDVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  this_00 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_e8,"Output settings",(char *)0x0,-1);
  QGroupBox::QGroupBox(this_00,(QString *)local_e8.data,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  this_01 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_01,(QWidget *)0x0);
  pQVar3 = (QLabel *)operator_new(0x28);
  tr((QString *)&local_e8,"Buffer size",(char *)0x0,-1);
  QLabel::QLabel(pQVar3,&local_e8,0,0);
  QGridLayout::addWidget(this_01,pQVar3,0,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pQVar4 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar4,(QWidget *)0x0);
  this->mLatencySpin = pQVar4;
  QGridLayout::addWidget(this_01,pQVar4,0,1,0);
  pQVar3 = (QLabel *)operator_new(0x28);
  tr((QString *)&local_e8,"Period",(char *)0x0,-1);
  QLabel::QLabel(pQVar3,&local_e8,0,0);
  QGridLayout::addWidget(this_01,pQVar3,1,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pQVar4 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar4,(QWidget *)0x0);
  this->mPeriodSpin = pQVar4;
  QGridLayout::addWidget(this_01,pQVar4,1,1,0);
  pQVar3 = (QLabel *)operator_new(0x28);
  tr((QString *)&local_e8,"Sample rate",(char *)0x0,-1);
  QLabel::QLabel(pQVar3,&local_e8,0,0);
  QGridLayout::addWidget(this_01,pQVar3,2,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  pQVar5 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar5,(QWidget *)0x0);
  this->mSamplerateCombo = pQVar5;
  QGridLayout::addWidget(this_01,pQVar5,2,1,0);
  QWidget::setLayout((QLayout *)this_00);
  pDVar2 = (DeviceGroup *)operator_new(0x48);
  tr((QString *)&local_e8,"MIDI Input",(char *)0x0,-1);
  DeviceGroup::DeviceGroup(pDVar2,(QString *)&local_e8);
  this->mMidiGroup = pDVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  QGroupBox::setCheckable(SUB81(this->mMidiGroup,0));
  pDVar2 = this->mMidiGroup;
  MidiConfig::isEnabled(local_b8);
  QGroupBox::setChecked(SUB81(pDVar2,0));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02);
  QBoxLayout::addWidget(this_02,this->mAudioGroup,0,0);
  QBoxLayout::addWidget(this_02,this_00,0,0);
  QBoxLayout::addWidget(this_02,this->mMidiGroup,0,0);
  QBoxLayout::addStretch((int)this_02);
  QWidget::setLayout((QLayout *)this);
  enumerator = this->mAudioEnumerator;
  pDVar2 = this->mAudioGroup;
  iVar1 = SoundConfig::backendIndex(local_c0);
  device = SoundConfig::deviceIndex(local_c0);
  uVar6 = (ulong)device;
  DeviceGroup::init<AudioEnumerator>(pDVar2,enumerator,iVar1,device);
  index = 0;
  while( true ) {
    iVar1 = (int)uVar6;
    pQVar5 = this->mSamplerateCombo;
    if (index == 7) break;
    tr((QString *)&local_60,"%1 Hz",(char *)0x0,-1);
    iVar1 = StandardRates::get(index);
    uVar6 = 0;
    QString::arg((QString *)&local_48,(QString *)&local_60,iVar1,0,10,(QChar)0x20);
    local_e8.shared = (PrivateShared *)0x0;
    local_e8._8_8_ = 0;
    local_e8._16_8_ = 0;
    local_d0 = 2;
    QComboBox::addItem(pQVar5,(QString *)&local_48,(QVariant *)&local_e8);
    QVariant::~QVariant((QVariant *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    index = index + 1;
  }
  SoundConfig::samplerateIndex(local_c0);
  QComboBox::setCurrentIndex((int)pQVar5);
  pQVar4 = this->mLatencySpin;
  SoundConfig::latency(local_c0);
  QSpinBox::setValue((int)pQVar4);
  pQVar4 = this->mPeriodSpin;
  SoundConfig::period(local_c0);
  QSpinBox::setValue((int)pQVar4);
  SoundConfigTab::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this->mLatencySpin,(QSpinBox *)0x1f4,min,iVar1);
  SoundConfigTab::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this->mPeriodSpin,(QSpinBox *)0x64,min_00,iVar1);
  enumerator_00 = this->mMidiEnumerator;
  pDVar2 = this->mMidiGroup;
  iVar1 = MidiConfig::backendIndex(local_b8);
  device_00 = MidiConfig::portIndex(local_b8);
  DeviceGroup::init<MidiEnumerator>(pDVar2,enumerator_00,iVar1,device_00);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_e8._8_8_ = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_68,(offset_in_QComboBox_to_subr)this->mSamplerateCombo,
             (Object *)QComboBox::currentIndexChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_e8._8_8_ = 0;
  QObject::connect<void(QSpinBox::*)(int),void(ConfigTab::*)()>
            (local_70,(offset_in_QSpinBox_to_subr)this->mLatencySpin,
             (Object *)QSpinBox::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_e8._8_8_ = 0;
  QObject::connect<void(QSpinBox::*)(int),void(ConfigTab::*)()>
            (local_78,(offset_in_QSpinBox_to_subr)this->mPeriodSpin,(Object *)QSpinBox::valueChanged
             ,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  local_e8.shared = (PrivateShared *)audioApiChanged;
  local_e8._8_8_ = 0;
  QObject::connect<void(QComboBox::*)(int),void(SoundConfigTab::*)(int)>
            (local_80,(offset_in_QComboBox_to_subr)this->mAudioGroup->mApiCombo,
             (Object *)QComboBox::currentIndexChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)1>;
  local_e8._8_8_ = 0;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_88,(offset_in_QComboBox_to_subr)this->mAudioGroup->mDeviceCombo,
             (Object *)QComboBox::currentIndexChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  local_e8.shared = (PrivateShared *)audioRescan;
  local_e8._8_8_ = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(SoundConfigTab::*)()>
            (local_90,(offset_in_QAbstractButton_to_subr)this->mAudioGroup->mRescanButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)8>;
  local_e8._8_8_ = 0;
  QObject::connect<void(QGroupBox::*)(bool),void(ConfigTab::*)()>
            (local_98,(offset_in_QGroupBox_to_subr)this->mMidiGroup,(Object *)QGroupBox::toggled,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  local_e8.shared = (PrivateShared *)midiApiChanged;
  local_e8._8_8_ = 0;
  QObject::connect<void(QComboBox::*)(int),void(SoundConfigTab::*)(int)>
            (local_a0,(offset_in_QComboBox_to_subr)this->mMidiGroup->mApiCombo,
             (Object *)QComboBox::currentIndexChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  local_e8.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)8>;
  local_e8._8_8_ = 0;
  QObject::connect<void(QComboBox::*)(int),void(ConfigTab::*)()>
            (local_a8,(offset_in_QComboBox_to_subr)this->mMidiGroup->mDeviceCombo,
             (Object *)QComboBox::currentIndexChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  local_e8.shared = (PrivateShared *)midiRescan;
  local_e8._8_8_ = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(SoundConfigTab::*)()>
            (local_b0,(offset_in_QAbstractButton_to_subr)this->mMidiGroup->mRescanButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  return;
}

Assistant:

SoundConfigTab::SoundConfigTab(
    MidiConfig const& midiConfig,
    SoundConfig const& soundConfig,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    ConfigTab(parent),
    mAudioEnumerator(audio),
    mMidiEnumerator(midi)
{

    mAudioGroup = new DeviceGroup(tr("Output device"));

    auto audioGroup = new QGroupBox(tr("Output settings"));
    auto audioLayout = new QGridLayout;

    // row 0, buffer size (latency)
    audioLayout->addWidget(new QLabel(tr("Buffer size")), 0, 0);
    mLatencySpin = new QSpinBox;
    audioLayout->addWidget(mLatencySpin, 0, 1);

    // row 1, period
    audioLayout->addWidget(new QLabel(tr("Period")), 1, 0);
    mPeriodSpin = new QSpinBox;
    audioLayout->addWidget(mPeriodSpin, 1, 1);

    // row 2, samplerate
    audioLayout->addWidget(new QLabel(tr("Sample rate")), 2, 0);
    mSamplerateCombo = new QComboBox;
    audioLayout->addWidget(mSamplerateCombo, 2, 1);

    audioGroup->setLayout(audioLayout);

    mMidiGroup = new DeviceGroup(tr("MIDI Input"));
    mMidiGroup->setCheckable(true);
    mMidiGroup->setChecked(midiConfig.isEnabled());

    auto layout = new QVBoxLayout;
    layout->addWidget(mAudioGroup);
    layout->addWidget(audioGroup);
    layout->addWidget(mMidiGroup);
    layout->addStretch();
    setLayout(layout);


    // settings
    mAudioGroup->init(mAudioEnumerator, soundConfig.backendIndex(), soundConfig.deviceIndex());

    // populate samplerate combo
    for (int i = 0; i != StandardRates::COUNT; ++i) {
        mSamplerateCombo->addItem(tr("%1 Hz").arg(StandardRates::get(i)));
    }

    mSamplerateCombo->setCurrentIndex(soundConfig.samplerateIndex());
    mLatencySpin->setValue(soundConfig.latency());
    mPeriodSpin->setValue(soundConfig.period());

    auto setupTimeSpinbox = [](QSpinBox &spin, int min, int max) {
        spin.setSuffix(tr(" ms"));
        spin.setMinimum(min);
        spin.setMaximum(max);
    };
    setupTimeSpinbox(*mLatencySpin, SoundConfig::MIN_LATENCY, SoundConfig::MAX_LATENCY);
    setupTimeSpinbox(*mPeriodSpin, SoundConfig::MIN_PERIOD, SoundConfig::MAX_PERIOD);

    mMidiGroup->init(mMidiEnumerator, midiConfig.backendIndex(), midiConfig.portIndex());

    // any changes made by the user will mark this tab as "dirty"
    connect(mSamplerateCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mLatencySpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    connect(mPeriodSpin, qOverload<int>(&QSpinBox::valueChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);

    connect(mAudioGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::audioApiChanged);
    connect(mAudioGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategorySound>);
    lazyconnect(mAudioGroup->mRescanButton, clicked, this, audioRescan);

    lazyconnect(mMidiGroup, toggled, this, setDirty<Config::CategoryMidi>);
    connect(mMidiGroup->mApiCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::midiApiChanged);
    connect(mMidiGroup->mDeviceCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &SoundConfigTab::setDirty<Config::CategoryMidi>);
    lazyconnect(mMidiGroup->mRescanButton, clicked, this, midiRescan);
}